

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Tools.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
 unicpp::codepoint_to_utf16<std::back_insert_iterator<std::__cxx11::u16string>>
           (char32_t codepoint,
           back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           output)

{
  if (0xffff < (uint)codepoint) {
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    push_back(output.container,(ushort)((uint)(codepoint + L'\x000f0000') >> 10) & 0x3ff | 0xd800);
    codepoint = codepoint & 0x3ffU | 0xdc00;
  }
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  push_back(output.container,(char16_t)codepoint);
  return (back_insert_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
          )output.container;
}

Assistant:

OutputIterator codepoint_to_utf16(char32_t codepoint, OutputIterator output)
{
    if(codepoint < 0x10000)
    {
        *(output++) = static_cast<char16_t>(codepoint);
    }
    else
    {
        char32_t u = codepoint - 0x10000;
        *(output++) = 0xD800 | (static_cast<char16_t>(u >> 10) & 0x3FF);
        *(output++) = 0xDC00 | (static_cast<char16_t>(u) & 0x3FF);
    }

    return output;
}